

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O0

void rr::pa::TriangleStripAdjacency::
     exec<__gnu_cxx::__normal_iterator<rr::pa::TriangleAdjacency*,std::vector<rr::pa::TriangleAdjacency,std::allocator<rr::pa::TriangleAdjacency>>>>
               (__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  int iVar1;
  reference pTVar2;
  __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
  local_1b8;
  TriangleAdjacency local_1b0;
  __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
  local_178;
  TriangleAdjacency local_170;
  __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
  local_138;
  TriangleAdjacency local_130;
  __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
  local_f8;
  TriangleAdjacency local_f0;
  __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
  local_b8;
  TriangleAdjacency local_b0;
  ulong local_78;
  size_t i;
  size_t primitiveCount;
  TriangleAdjacency local_60;
  ProvokingVertex local_24;
  size_t sStack_20;
  ProvokingVertex provokingConvention_local;
  size_t numVertices_local;
  VertexPacket **vertices_local;
  __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
  outputIterator_local;
  
  if (5 < numVertices) {
    local_24 = provokingConvention;
    sStack_20 = numVertices;
    numVertices_local = (size_t)vertices;
    vertices_local = &(outputIterator._M_current)->v0;
    if (numVertices < 8) {
      iVar1 = 4;
      if (provokingConvention == PROVOKINGVERTEX_FIRST) {
        iVar1 = 0;
      }
      TriangleAdjacency::TriangleAdjacency
                (&local_60,*vertices,vertices[1],vertices[2],vertices[5],vertices[4],vertices[3],
                 iVar1);
      primitiveCount =
           (size_t)__gnu_cxx::
                   __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                   ::operator++((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                                 *)&vertices_local,0);
      pTVar2 = __gnu_cxx::
               __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
               ::operator*((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                            *)&primitiveCount);
      memcpy(pTVar2,&local_60,0x34);
    }
    else {
      i = getPrimitiveCount(numVertices);
      iVar1 = 4;
      if (local_24 == PROVOKINGVERTEX_FIRST) {
        iVar1 = 0;
      }
      TriangleAdjacency::TriangleAdjacency
                (&local_b0,*(VertexPacket **)numVertices_local,
                 *(VertexPacket **)(numVertices_local + 8),
                 *(VertexPacket **)(numVertices_local + 0x10),
                 *(VertexPacket **)(numVertices_local + 0x30),
                 *(VertexPacket **)(numVertices_local + 0x20),
                 *(VertexPacket **)(numVertices_local + 0x18),iVar1);
      local_b8 = __gnu_cxx::
                 __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                 ::operator++((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                               *)&vertices_local,0);
      pTVar2 = __gnu_cxx::
               __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
               ::operator*(&local_b8);
      memcpy(pTVar2,&local_b0,0x34);
      for (local_78 = 1; local_78 + 1 < i; local_78 = local_78 + 1) {
        if ((local_78 & 1) == 1) {
          iVar1 = 4;
          if (local_24 == PROVOKINGVERTEX_FIRST) {
            iVar1 = 2;
          }
          TriangleAdjacency::TriangleAdjacency
                    (&local_f0,*(VertexPacket **)(numVertices_local + 0x10 + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + (local_78 * 2 + -2) * 8),
                     *(VertexPacket **)(numVertices_local + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + 0x18 + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + 0x20 + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + 0x30 + local_78 * 0x10),iVar1);
          local_f8 = __gnu_cxx::
                     __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                     ::operator++((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                                   *)&vertices_local,0);
          pTVar2 = __gnu_cxx::
                   __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                   ::operator*(&local_f8);
          memcpy(pTVar2,&local_f0,0x34);
        }
        else {
          iVar1 = 4;
          if (local_24 == PROVOKINGVERTEX_FIRST) {
            iVar1 = 0;
          }
          TriangleAdjacency::TriangleAdjacency
                    (&local_130,*(VertexPacket **)(numVertices_local + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + (local_78 * 2 + -2) * 8),
                     *(VertexPacket **)(numVertices_local + 0x10 + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + 0x30 + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + 0x20 + local_78 * 0x10),
                     *(VertexPacket **)(numVertices_local + 0x18 + local_78 * 0x10),iVar1);
          local_138 = __gnu_cxx::
                      __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                      ::operator++((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                                    *)&vertices_local,0);
          pTVar2 = __gnu_cxx::
                   __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                   ::operator*(&local_138);
          memcpy(pTVar2,&local_130,0x34);
        }
      }
      if ((local_78 & 1) == 1) {
        iVar1 = 4;
        if (local_24 == PROVOKINGVERTEX_FIRST) {
          iVar1 = 2;
        }
        TriangleAdjacency::TriangleAdjacency
                  (&local_170,*(VertexPacket **)(numVertices_local + 0x10 + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + (local_78 * 2 + -2) * 8),
                   *(VertexPacket **)(numVertices_local + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + 0x18 + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + 0x20 + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + 0x28 + local_78 * 0x10),iVar1);
        local_178 = __gnu_cxx::
                    __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                    ::operator++((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                                  *)&vertices_local,0);
        pTVar2 = __gnu_cxx::
                 __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                 ::operator*(&local_178);
        memcpy(pTVar2,&local_170,0x34);
      }
      else {
        iVar1 = 4;
        if (local_24 == PROVOKINGVERTEX_FIRST) {
          iVar1 = 0;
        }
        TriangleAdjacency::TriangleAdjacency
                  (&local_1b0,*(VertexPacket **)(numVertices_local + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + (local_78 * 2 + -2) * 8),
                   *(VertexPacket **)(numVertices_local + 0x10 + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + 0x28 + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + 0x20 + local_78 * 0x10),
                   *(VertexPacket **)(numVertices_local + 0x18 + local_78 * 0x10),iVar1);
        local_1b8 = __gnu_cxx::
                    __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                    ::operator++((__normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                                  *)&vertices_local,0);
        pTVar2 = __gnu_cxx::
                 __normal_iterator<rr::pa::TriangleAdjacency_*,_std::vector<rr::pa::TriangleAdjacency,_std::allocator<rr::pa::TriangleAdjacency>_>_>
                 ::operator*(&local_1b8);
        memcpy(pTVar2,&local_1b0,0x34);
      }
    }
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices < 6)
		{
		}
		else if (numVertices < 8)
		{
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[5], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
		else
		{
			const size_t primitiveCount = getPrimitiveCount(numVertices);
			size_t i;

			// first
			*(outputIterator++) = TriangleAdjacency(vertices[0], vertices[1], vertices[2], vertices[6], vertices[4], vertices[3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));

			// middle
			for (i = 1; i + 1 < primitiveCount; ++i)
			{
				// odd
				if (i % 2 == 1)
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+6], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
				}
				// even
				else
				{
					*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+6], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
				}
			}

			// last

			// odd
			if (i % 2 == 1)
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+2], vertices[2*i-2], vertices[2*i+0], vertices[2*i+3], vertices[2*i+4], vertices[2*i+5], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (2) : (4));
			// even
			else
				*(outputIterator++) = TriangleAdjacency(vertices[2*i+0], vertices[2*i-2], vertices[2*i+2], vertices[2*i+5], vertices[2*i+4], vertices[2*i+3], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (4));
		}
	}